

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O0

void __thiscall Qentem::Value<wchar_t>::operator+=(Value<wchar_t> *this,ObjectT *obj)

{
  bool bVar1;
  HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *pHVar2;
  Value<wchar_t> local_30;
  HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *local_18;
  ObjectT *obj_local;
  Value<wchar_t> *this_local;
  
  local_18 = obj;
  obj_local = (ObjectT *)this;
  bVar1 = isObject(this);
  if (bVar1) {
    pHVar2 = Memory::Move<Qentem::HArray<Qentem::String<wchar_t>,Qentem::Value<wchar_t>>>(local_18);
    HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>::operator+=
              ((HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *)this,pHVar2);
  }
  else {
    bVar1 = isArray(this);
    if (!bVar1) {
      reset(this);
      setTypeToArray(this);
    }
    pHVar2 = Memory::Move<Qentem::HArray<Qentem::String<wchar_t>,Qentem::Value<wchar_t>>>(local_18);
    Value(&local_30,pHVar2);
    Array<Qentem::Value<wchar_t>_>::operator+=((Array<Qentem::Value<wchar_t>_> *)this,&local_30);
    ~Value(&local_30);
  }
  return;
}

Assistant:

inline void operator+=(ObjectT &&obj) {
        if (isObject()) {
            object_ += Memory::Move(obj);
        } else {
            if (!isArray()) {
                reset();
                setTypeToArray();
            }

            array_ += Value{Memory::Move(obj)};
        }
    }